

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceDecomposition.hpp
# Opt level: O2

void __thiscall OpenMD::ForceDecomposition::~ForceDecomposition(ForceDecomposition *this)

{
  this->_vptr_ForceDecomposition = (_func_int **)&PTR__ForceDecomposition_002c4bf0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&this->cellList_);
  std::_Vector_base<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::~_Vector_base
            (&(this->cellOffsets_).
              super__Vector_base<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>);
  std::_Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::~_Vector_base
            (&(this->atypesLocal).
              super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->massFactors).super__Vector_base<double,_std::allocator<double>_>);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&this->groupList_);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&this->excludesForAtom);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&this->topoDist);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&this->toposForAtom);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->regions).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->idents).super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

virtual ~ForceDecomposition() {}